

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::LSTMParams::MergePartialFromCodedStream
          (LSTMParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  uint8 *puVar5;
  bool bVar6;
  uint uVar7;
  uint32 uVar8;
  undefined8 in_RAX;
  int iVar9;
  char cVar10;
  ulong uVar11;
  int iVar12;
  pair<unsigned_long,_bool> pVar13;
  pair<unsigned_long,_bool> pVar14;
  pair<unsigned_long,_bool> pVar15;
  pair<unsigned_long,_bool> pVar16;
  pair<unsigned_long,_bool> pVar17;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    pbVar4 = input->buffer_;
    uVar8 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_00138fe8;
        uVar11 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_00138fe8:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar8 = (uint32)uVar11;
    iVar12 = 6;
    iVar9 = iVar12;
    if ((uVar11 & 0x100000000) == 0) {
LAB_00138db6:
      iVar9 = 7;
      if (((uVar8 & 7) != 4 && uVar8 != 0) &&
         (bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8), iVar9 = iVar12
         , bVar6)) {
LAB_00138ddb:
        iVar9 = 0;
      }
    }
    else {
      uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar10 = (char)uVar11;
      if (uVar7 == 0x3c) {
        if (cVar10 != -0x1b) goto LAB_00138db6;
        puVar5 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)((long)&uStack_38 + 4));
          if (!bVar6) goto LAB_00138ddd;
        }
        else {
          uStack_38 = CONCAT44(*(undefined4 *)puVar5,(undefined4)uStack_38);
          input->buffer_ = puVar5 + 4;
        }
        this->cellclipthreshold_ = uStack_38._4_4_;
        goto LAB_00138ddb;
      }
      if (uVar7 == 0x14) {
        if (cVar10 != -0x60) goto LAB_00138db6;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar17._8_8_ = 1;
          pVar17.first = (long)(char)uVar3;
        }
        else {
          pVar17 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->hasbiasvectors_ = pVar17.first != 0;
          goto LAB_00138ddb;
        }
      }
      else if (uVar7 == 0x1e) {
        if (cVar10 != -0x10) goto LAB_00138db6;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar13._8_8_ = 1;
          pVar13.first = (long)(char)uVar3;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->forgetbias_ = pVar13.first != 0;
          goto LAB_00138ddb;
        }
      }
      else if (uVar7 == 0x28) {
        if (cVar10 != '@') goto LAB_00138db6;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar15._8_8_ = 1;
          pVar15.first = (long)(char)uVar3;
        }
        else {
          pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->haspeepholevectors_ = pVar15.first != 0;
          goto LAB_00138ddb;
        }
      }
      else if (uVar7 == 0x32) {
        if (cVar10 != -0x70) goto LAB_00138db6;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar14._8_8_ = 1;
          pVar14.first = (long)(char)uVar3;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->coupledinputandforgetgate_ = pVar14.first != 0;
          goto LAB_00138ddb;
        }
      }
      else {
        if ((uVar7 != 10) || (cVar10 != 'P')) goto LAB_00138db6;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar16._8_8_ = 1;
          pVar16.first = (long)(char)uVar3;
        }
        else {
          pVar16 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->sequenceoutput_ = pVar16.first != 0;
          goto LAB_00138ddb;
        }
      }
    }
LAB_00138ddd:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool LSTMParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LSTMParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // bool sequenceOutput = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &sequenceoutput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBiasVectors = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbiasvectors_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool forgetBias = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(240u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &forgetbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasPeepholeVectors = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(320u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &haspeepholevectors_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool coupledInputAndForgetGate = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &coupledinputandforgetgate_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float cellClipThreshold = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(485u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &cellclipthreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LSTMParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LSTMParams)
  return false;
#undef DO_
}